

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int width;
  ostream *poVar1;
  int iVar2;
  stringstream *dmin;
  char *pcVar3;
  int window_size;
  string local_378 [32];
  double scale;
  double weight;
  double baseline;
  double focal_length;
  _Vector_base<int,_std::allocator<int>_> local_338;
  string output_file;
  _InputArray local_300;
  string output2_file;
  Mat image2;
  long local_2b8;
  Mat image1;
  long local_258;
  int *local_228;
  Mat naive_disparities;
  stringstream out1;
  ostream local_198 [376];
  
  focal_length = 1247.0;
  baseline = 213.0;
  window_size = 3;
  weight = 500.0;
  scale = 3.0;
  if (argc < 4) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," IMAGE1 IMAGE2 OUTPUT_FILE OUTPUT_FILE2");
    std::endl<char,std::char_traits<char>>(poVar1);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out1,argv[1],(allocator<char> *)&image2);
  cv::imread((string *)&image1,(int)&out1);
  std::__cxx11::string::~string((string *)&out1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out1,argv[2],(allocator<char> *)&naive_disparities);
  cv::imread((string *)&image2,(int)&out1);
  std::__cxx11::string::~string((string *)&out1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_file,argv[3],(allocator<char> *)&out1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output2_file,argv[4],(allocator<char> *)&out1);
  if (local_258 == 0) {
    pcVar3 = "No image1 data";
  }
  else {
    if (local_2b8 != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "------------------ Parameters -------------------");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"focal_length = ");
      poVar1 = std::ostream::_M_insert<double>(1247.0);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"baseline = ");
      poVar1 = std::ostream::_M_insert<double>(213.0);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"window_size = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,3);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"occlusion weights = ");
      poVar1 = std::ostream::_M_insert<double>(500.0);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"disparity added due to image cropping = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x43);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"scaling of disparity images to show = ");
      poVar1 = std::ostream::_M_insert<double>(3.0);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"output filename = ");
      poVar1 = std::operator<<(poVar1,argv[3]);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar1);
      iVar2 = *local_228;
      width = local_228[1];
      cv::Mat::zeros((int)&out1,iVar2,width);
      dmin = &out1;
      cv::MatExpr::operator_cast_to_Mat((MatExpr *)&naive_disparities);
      cv::MatExpr::~MatExpr((MatExpr *)&out1);
      StereoEstimation_Naive
                (&window_size,(int *)dmin,iVar2,width,&image1,&image2,&naive_disparities,&scale);
      Disparity2PointCloud
                (&output_file,iVar2,width,&naive_disparities,&window_size,(int *)&baseline,&baseline
                 ,&focal_length);
      std::__cxx11::stringstream::stringstream((stringstream *)&out1);
      poVar1 = std::operator<<(local_198,(string *)&output_file);
      std::operator<<(poVar1,"_naive.png");
      std::__cxx11::stringbuf::str();
      local_300.sz.width = 0;
      local_300.sz.height = 0;
      local_300.flags = 0x1010000;
      local_338._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_338._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_338._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_300.obj = &naive_disparities;
      cv::imwrite(local_378,&local_300,(vector *)&local_338);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_338);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::string<std::allocator<char>>
                (local_378,"Naive",(allocator<char> *)&local_300);
      cv::namedWindow(local_378,1);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::string<std::allocator<char>>
                (local_378,"Naive",(allocator<char> *)&local_338);
      local_300.sz.width = 0;
      local_300.sz.height = 0;
      local_300.flags = 0x1010000;
      local_300.obj = &naive_disparities;
      cv::imshow(local_378,&local_300);
      std::__cxx11::string::~string(local_378);
      StereoEstimation_Dynamic(&window_size,iVar2,width,&image1,&image2,&weight,&output2_file);
      iVar2 = 0;
      cv::waitKey(0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&out1);
      cv::Mat::~Mat(&naive_disparities);
      goto LAB_0010282c;
    }
    pcVar3 = "No image2 data";
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar2 = 1;
LAB_0010282c:
  std::__cxx11::string::~string((string *)&output2_file);
  std::__cxx11::string::~string((string *)&output_file);
  cv::Mat::~Mat(&image2);
  cv::Mat::~Mat(&image1);
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {

  ////////////////
  // Parameters //
  ////////////////

  // camera setup parameters
  const double focal_length = 1247;
  const double baseline = 213;

  // stereo estimation parameters
  const int dmin = 67;
  const int window_size = 3;
  const double weight = 500;
  const double scale = 3;

  ///////////////////////////
  // Commandline arguments //
  ///////////////////////////
  int x = argc;
  if (argc < 4) {
    std::cerr << "Usage: " << argv[0] << " IMAGE1 IMAGE2 OUTPUT_FILE OUTPUT_FILE2" << std::endl;
    return 1;
  }

  cv::Mat image1 = cv::imread(argv[1], cv::IMREAD_GRAYSCALE);
  cv::Mat image2 = cv::imread(argv[2], cv::IMREAD_GRAYSCALE);
  const std::string output_file = argv[3];
  const std::string output2_file = argv[4];

  if (!image1.data) {
    std::cerr << "No image1 data" << std::endl;
    return EXIT_FAILURE;
  }

  if (!image2.data) {
    std::cerr << "No image2 data" << std::endl;
    return EXIT_FAILURE;
  }

  std::cout << "------------------ Parameters -------------------" << std::endl;
  std::cout << "focal_length = " << focal_length << std::endl;
  std::cout << "baseline = " << baseline << std::endl;
  std::cout << "window_size = " << window_size << std::endl;
  std::cout << "occlusion weights = " << weight << std::endl;
  std::cout << "disparity added due to image cropping = " << dmin << std::endl;
  std::cout << "scaling of disparity images to show = " << scale << std::endl;
  std::cout << "output filename = " << argv[3] << std::endl;
  std::cout << "-------------------------------------------------" << std::endl;

   int height = image1.size().height;
   int width = image1.size().width;

  ////////////////////
  // Reconstruction //
  ////////////////////

  // Naive disparity image
 
  cv::Mat naive_disparities = cv::Mat::zeros(height, width, CV_8UC1);
  

  StereoEstimation_Naive(
    window_size, dmin, height, width,
    image1, image2,
    naive_disparities, scale);

  ////////////
  // Output //
  ////////////

  // reconstruction
  Disparity2PointCloud(
    output_file,
    height, width, naive_disparities,
    window_size, dmin, baseline, focal_length);

  // save / display images
  std::stringstream out1;
  out1 << output_file << "_naive.png";
  cv::imwrite(out1.str(), naive_disparities);

  cv::namedWindow("Naive", cv::WINDOW_AUTOSIZE);
  cv::imshow("Naive", naive_disparities);

  // Dynamic disparity image
  StereoEstimation_Dynamic(
      window_size,
      height,
      width,
      image1, image2, weight, output2_file); // disparity image is decalred in the function


  cv::waitKey(0);

  return 0;
}